

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

NodeData __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::DFS(SCCAnalyzer *this,Descriptor *descriptor)

{
  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
  *this_00;
  pointer *pppDVar1;
  int iVar2;
  size_type sVar3;
  LogMessage *other;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  SCC *this_01;
  int iVar6;
  int i;
  long lVar7;
  long lVar8;
  NodeData NVar9;
  LogFinisher local_71;
  Descriptor *descriptor_local;
  Descriptor *child;
  
  this_00 = &this->cache_;
  descriptor_local = descriptor;
  sVar3 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
          ::count(this_00,&descriptor_local);
  if (sVar3 != 0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&child,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x29b);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&child,"CHECK failed: (cache_.count(descriptor)) == (0): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage((LogMessage *)&child);
  }
  pmVar4 = std::
           map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
           ::operator[](this_00,&descriptor_local);
  iVar2 = this->index_;
  this->index_ = iVar2 + 1;
  pmVar4->lowlink = iVar2;
  pmVar4->index = iVar2;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(&this->stack_,&descriptor_local);
  lVar8 = 0;
  lVar7 = 0;
  do {
    if (*(int *)(descriptor_local + 0x2c) <= lVar7) {
      if (pmVar4->index == pmVar4->lowlink) {
        this_01 = CreateSCC(this);
        do {
          child = (this->stack_).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1];
          std::
          vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::push_back(&this_01->descriptors,&child);
          pppDVar1 = &(this->stack_).
                      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppDVar1 = *pppDVar1 + -1;
          pmVar5 = std::
                   map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
                   ::operator[](this_00,&child);
          pmVar5->scc = this_01;
        } while (child != descriptor_local);
      }
      NVar9.scc = pmVar4->scc;
      NVar9.index = pmVar4->index;
      NVar9.lowlink = pmVar4->lowlink;
      return NVar9;
    }
    child = FieldDescriptor::message_type
                      ((FieldDescriptor *)(*(long *)(descriptor_local + 0x30) + lVar8));
    if (child != (Descriptor *)0x0) {
      sVar3 = std::
              map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
              ::count(this_00,&child);
      if (sVar3 == 0) {
        NVar9 = DFS(this,child);
        iVar6 = NVar9.lowlink;
        iVar2 = pmVar4->lowlink;
      }
      else {
        pmVar5 = std::
                 map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
                 ::operator[](this_00,&child);
        if (pmVar5->scc != (SCC *)0x0) goto LAB_00248426;
        iVar2 = pmVar5->index;
        iVar6 = pmVar4->lowlink;
      }
      if (iVar2 < iVar6) {
        iVar6 = iVar2;
      }
      pmVar4->lowlink = iVar6;
    }
LAB_00248426:
    lVar7 = lVar7 + 1;
    lVar8 = lVar8 + 0xa8;
  } while( true );
}

Assistant:

SCCAnalyzer::NodeData SCCAnalyzer::DFS(const Descriptor* descriptor) {
  // Must not have visited already.
  GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

  // Mark visited by inserting in map.
  NodeData& result = cache_[descriptor];
  // Initialize data structures.
  result.index = result.lowlink = index_++;
  stack_.push_back(descriptor);

  // Recurse the fields / nodes in graph
  for (int i = 0; i < descriptor->field_count(); i++) {
    const Descriptor* child = descriptor->field(i)->message_type();
    if (child) {
      if (cache_.count(child) == 0) {
        // unexplored node
        NodeData child_data = DFS(child);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[child];
        if (child_data.scc == NULL) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
  }
  if (result.index == result.lowlink) {
    // This is the root of a strongly connected component
    SCC* scc = CreateSCC();
    while (true) {
      const Descriptor* scc_desc = stack_.back();
      scc->descriptors.push_back(scc_desc);
      // Remove from stack
      stack_.pop_back();
      cache_[scc_desc].scc = scc;

      if (scc_desc == descriptor) break;
    }
  }
  return result;
}